

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Impl::load(Impl *this,SchemaLoader *loader,uint64_t id)

{
  undefined1 local_50 [24];
  Node *node;
  Node *local_30;
  Node *_node1307;
  Impl *self;
  uint64_t id_local;
  SchemaLoader *loader_local;
  Impl *this_local;
  
  _node1307 = (Node *)this;
  self = (Impl *)id;
  id_local = (uint64_t)loader;
  loader_local = (SchemaLoader *)this;
  findNode((Impl *)&node,(uint64_t)this);
  local_50._16_8_ =
       kj::_::readMaybe<capnp::compiler::Compiler::Node>
                 ((Maybe<capnp::compiler::Compiler::Node_&> *)&node);
  if ((Node *)local_50._16_8_ != (Node *)0x0) {
    local_30 = (Node *)local_50._16_8_;
    Node::getBootstrapSchema((Node *)local_50);
    kj::Maybe<capnp::Schema>::~Maybe((Maybe<capnp::Schema> *)local_50);
  }
  return;
}

Assistant:

void Compiler::Impl::load(const SchemaLoader& loader, uint64_t id) const {
  // We know that this load() is only called from the bootstrap loader which is already protected
  // by our mutex, so we can drop thread-safety.
  auto& self = const_cast<Compiler::Impl&>(*this);

  KJ_IF_SOME(node, self.findNode(id)) {
    node.getBootstrapSchema();
  }
}